

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

uint lodepng::convertToXYZ_chrm
               (float *im,uint w,uint h,LodePNGInfo *info,uint use_icc,LodePNGICC *icc,
               float *whitepoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  
  uVar4 = getChrm(&local_58,whitepoint,use_icc,icc,info);
  uVar5 = (ulong)uVar4;
  if (uVar4 == 0) {
    uVar4 = h * w;
    if (use_icc == 0) {
      if (uVar4 == 0) goto LAB_0011cad5;
    }
    else {
      bVar7 = icc->inputspace == 2;
      uVar5 = (ulong)bVar7;
      if (!bVar7 || uVar4 == 0) goto LAB_0011cad5;
    }
    uVar5 = (ulong)uVar4 << 4;
    uVar6 = 0;
    do {
      fVar1 = *(float *)((long)im + uVar6);
      fVar2 = *(float *)((long)im + uVar6 + 4);
      fVar3 = *(float *)((long)im + uVar6 + 8);
      *(ulong *)((long)im + uVar6) =
           CONCAT44(fVar3 * local_44 + fVar1 * fStack_4c + fVar2 * local_48,
                    fVar3 * fStack_50 + fVar1 * local_58 + fVar2 * fStack_54);
      *(float *)((long)im + uVar6 + 8) = fVar3 * local_38 + fVar1 * local_40 + fVar2 * local_3c;
      uVar6 = uVar6 + 0x10;
    } while (uVar5 != uVar6);
  }
LAB_0011cad5:
  return (uint)uVar5;
}

Assistant:

static unsigned convertToXYZ_chrm(float* im, unsigned w, unsigned h,
                                  const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc,
                                  float whitepoint[3]) {
  unsigned error = 0;
  size_t i;
  size_t n = w * h;
  float m[9]; /* XYZ to linear RGB matrix */

  /* Must be called even for grayscale, to get the correct whitepoint to output */
  error = getChrm(m, whitepoint, use_icc, icc, info);
  if(error) return error;

  /* Note: no whitepoint adaptation done to m here, because we only do the
  adaptation in convertFromXYZ (we only whitepoint adapt when going to the
  target RGB space, but here we're going from the source RGB space to XYZ) */

  /* Apply the above computed linear-RGB-to-XYZ matrix to the pixels.
  Skip the transform if it's the unit matrix (which is the case if grayscale profile) */
  if(!use_icc || icc->inputspace == 2) {
    for(i = 0; i < n; i++) {
      size_t j = i * 4;
      mulMatrix(&im[j + 0], &im[j + 1], &im[j + 2], m, im[j + 0], im[j + 1], im[j + 2]);
    }
  }

  return 0;
}